

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall gl4cts::TextureViewTestViewClasses::deinit(TextureViewTestViewClasses *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  if (this->m_decompressed_mipmap_data != (uchar *)0x0) {
    operator_delete__(this->m_decompressed_mipmap_data);
    this->m_decompressed_mipmap_data = (uchar *)0x0;
  }
  if (this->m_mipmap_data != (uchar *)0x0) {
    operator_delete__(this->m_mipmap_data);
    this->m_mipmap_data = (uchar *)0x0;
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  if (this->m_to_temp_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_temp_id);
    this->m_to_temp_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_view_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_view_to_id);
    this->m_view_to_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_id = 0;
  }
  (**(code **)(lVar2 + 0xff0))(0xd05,4);
  (**(code **)(lVar2 + 0xff0))(0xcf5,4);
  (**(code **)(lVar2 + 0x5e0))(0x8c89);
  return;
}

Assistant:

void TextureViewTestViewClasses::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_decompressed_mipmap_data != DE_NULL)
	{
		delete[] m_decompressed_mipmap_data;

		m_decompressed_mipmap_data = DE_NULL;
	}

	if (m_mipmap_data != DE_NULL)
	{
		delete[] m_mipmap_data;

		m_mipmap_data = DE_NULL;
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);

		m_to_id = 0;
	}

	if (m_to_temp_id != 0)
	{
		gl.deleteTextures(1, &m_to_temp_id);

		m_to_temp_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	if (m_view_to_id != 0)
	{
		gl.deleteTextures(1, &m_view_to_id);

		m_view_to_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}

	/* Bring back the default pixel storage settings that the test may have modified. */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	/* Restore rasterization */
	gl.enable(GL_RASTERIZER_DISCARD);
}